

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int parse_miniscript(char *miniscript,char **key_name_array,char **key_value_array,size_t array_len,
                    uint32_t flags,uint32_t target,uint32_t *network,uint32_t descriptor_depth,
                    uint32_t descriptor_index,wally_descriptor_script_item *script_item,
                    size_t item_len,uint32_t *properties,char **script_ignore_checksum)

{
  uint32_t derive_child_num;
  char *message;
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  uchar *bytes;
  uchar *puVar5;
  wally_descriptor_script_item *pwVar6;
  miniscript_node_t *node;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  miniscript_node_t *top_node;
  uchar *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  top_node = (miniscript_node_t *)0x0;
  if (miniscript == (char *)0x0 || 1 < flags) {
    return -2;
  }
  if (array_len == 0) {
    if (key_name_array != (char **)0x0 || key_value_array != (char **)0x0) {
      return -2;
    }
  }
  else if (key_name_array == (char **)0x0 || key_value_array == (char **)0x0) {
    return -2;
  }
  iVar3 = check_ascii_string(miniscript,1000000);
  if (iVar3 != 0) {
    return -2;
  }
  if (array_len != 0) {
    sVar9 = 0;
    while (array_len != sVar9) {
      if (key_name_array[sVar9] == (char *)0x0) {
        return -2;
      }
      message = key_value_array[sVar9];
      if (message == (char *)0x0) {
        return -2;
      }
      iVar3 = check_ascii_string(key_name_array[sVar9],0x10);
      if (iVar3 != 0) {
        return -2;
      }
      iVar3 = check_ascii_string(message,0x82);
      sVar9 = sVar9 + 1;
      if (iVar3 != 0) {
        return -2;
      }
    }
  }
  iVar3 = analyze_miniscript(miniscript,key_name_array,key_value_array,array_len,target,network,
                             flags,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,&top_node,
                             (char **)properties);
  if (iVar3 == 0) {
    if ((target & 2) != 0) {
      iVar3 = -2;
      if (top_node->info == (miniscript_item_t *)0x0) goto LAB_00105f0d;
      bytes = (uchar *)0x0;
      sVar9 = 0;
      if ((top_node->info->kind & 2) != 0) goto LAB_00105f7f;
      goto LAB_00105f13;
    }
LAB_00105f7f:
    if (script_item == (wally_descriptor_script_item *)0x0) {
      iVar3 = 0;
      goto LAB_00105f40;
    }
    bytes = (uchar *)0x0;
    sVar9 = 0;
    sVar7 = 0;
    while (sVar7 != item_len) {
      sVar2 = sVar9;
      if (script_item[sVar7].script == (uchar *)0x0) {
        sVar8 = sVar9;
        puVar5 = bytes;
        if (bytes == (uchar *)0x0) {
          bytes = (uchar *)wally_malloc(1000000);
          sVar8 = 1000000;
          puVar5 = bytes;
          sVar2 = 1000000;
          if (bytes == (uchar *)0x0) {
            bytes = (uchar *)0x0;
            iVar3 = -3;
            goto LAB_00105f13;
          }
        }
      }
      else {
        sVar8 = script_item[sVar7].script_len;
        puVar5 = script_item[sVar7].script;
      }
      sVar9 = sVar2;
      iVar3 = -2;
      pwVar6 = script_item + sVar7;
      derive_child_num = pwVar6->child_num;
      local_40 = 0;
      node = top_node;
      iVar4 = descriptor_depth + 1;
      while (iVar4 = iVar4 + -1, iVar1 = descriptor_index + 1, iVar4 != 0) {
        node = node->child;
        if (node == (miniscript_node_t *)0x0) goto LAB_00105f13;
      }
      while (iVar1 + -1 != 0) {
        node = node->next;
        iVar1 = iVar1 + -1;
        if (node == (miniscript_node_t *)0x0) goto LAB_00105f13;
      }
      local_58 = puVar5;
      local_48 = sVar7;
      local_38 = sVar8;
      puVar5 = (uchar *)wally_malloc(1000000);
      if (puVar5 == (uchar *)0x0) {
        iVar3 = -3;
        goto LAB_00105f13;
      }
      iVar3 = generate_script_from_miniscript
                        (node,(miniscript_node_t *)0x0,derive_child_num,puVar5,1000000,&local_40);
      local_50 = 0;
      if ((iVar3 == 0) && (local_50 = local_40, local_40 <= local_38)) {
        memcpy(local_58,puVar5,local_40);
      }
      wally_bzero(puVar5,1000000);
      wally_free(puVar5);
      sVar7 = local_50;
      if (iVar3 != 0) goto LAB_00105f13;
      iVar3 = -3;
      if (pwVar6->script == (uchar *)0x0) {
        puVar5 = (uchar *)wally_malloc(local_50);
        pwVar6->script = puVar5;
        if (puVar5 == (uchar *)0x0) goto LAB_00105f13;
        memcpy(puVar5,local_58,sVar7);
      }
      pwVar6->script_len = sVar7;
      sVar7 = local_48 + 1;
    }
    iVar3 = 0;
  }
  else {
LAB_00105f0d:
    bytes = (uchar *)0x0;
    sVar9 = 0;
LAB_00105f13:
    if (properties != (uint32_t *)0x0) {
      wally_free_string(*(char **)properties);
    }
  }
  if (bytes != (uchar *)0x0) {
    wally_bzero(bytes,sVar9);
    wally_free(bytes);
  }
LAB_00105f40:
  free_miniscript_node(top_node);
  return iVar3;
}

Assistant:

static int parse_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    uint32_t target,
    uint32_t *network,
    uint32_t descriptor_depth,
    uint32_t descriptor_index,
    struct wally_descriptor_script_item *script_item,
    size_t item_len,
    uint32_t *properties,
    char **script_ignore_checksum)
{
    int ret;
    size_t index;
    unsigned char *work_script = NULL;
    size_t work_script_len = 0;
    unsigned char *temp_script = NULL;
    size_t temp_script_len = 0;
    size_t write_len;
    struct miniscript_node_t *top_node = NULL;

    if (((flags & ~0x1) != 0) ||
        !miniscript || (array_len && (!key_name_array || !key_value_array)) ||
        (!array_len && (key_name_array || key_value_array)) ||
        check_ascii_string(miniscript, DESCRIPTOR_LIMIT_LENGTH))
        return WALLY_EINVAL;

    if (array_len) {
        for (index = 0; index < array_len; ++index) {
            if (!key_name_array[index] || !key_value_array[index])
                return WALLY_EINVAL;
            if (check_ascii_string(key_name_array[index], DESCRIPTOR_KEY_NAME_MAX_LENGTH) ||
                check_ascii_string(key_value_array[index], DESCRIPTOR_KEY_VALUE_MAX_LENGTH)) {
                return WALLY_EINVAL;
            }
        }
    }

    ret = analyze_miniscript(miniscript, key_name_array, key_value_array, array_len,
                             target, network, flags,
                             NULL, NULL, &top_node, script_ignore_checksum);
    if ((ret == WALLY_OK) && (target & DESCRIPTOR_KIND_DESCRIPTOR) &&
        (!top_node->info || !(top_node->info->kind & DESCRIPTOR_KIND_DESCRIPTOR)))
        ret = WALLY_EINVAL;
    if ((ret == WALLY_OK) && script_item) {
        for (index = 0; index < item_len; ++index) {
            write_len = 0;

            temp_script = script_item[index].script;
            temp_script_len = script_item[index].script_len;
            if (!temp_script) {
                if (!work_script) {
                    work_script = (unsigned char *)wally_malloc(DESCRIPTOR_LIMIT_LENGTH);
                    if (!work_script) {
                        ret = WALLY_ENOMEM;
                        break;
                    }
                    work_script_len = DESCRIPTOR_LIMIT_LENGTH;
                }
                temp_script = work_script;
                temp_script_len = work_script_len;
            }
            ret = convert_script_from_node(top_node, script_item[index].child_num,
                                           descriptor_depth, descriptor_index,
                                           temp_script, temp_script_len,
                                           &write_len);
            if (ret != WALLY_OK)
                break;
            if (!script_item[index].script) {
                script_item[index].script = (unsigned char *)wally_malloc(write_len);
                if (!script_item[index].script) {
                    ret = WALLY_ENOMEM;
                    break;
                }
                memcpy(script_item[index].script, temp_script, write_len);
            }
            script_item[index].script_len = write_len;
        }
    }
    if ((ret == WALLY_OK) && properties)
        *properties = top_node->type_properties;

    if ((ret != WALLY_OK) && script_ignore_checksum)
        wally_free_string(*script_ignore_checksum);
    if (work_script) {
        wally_bzero(work_script, work_script_len);
        wally_free(work_script);
    }
    free_miniscript_node(top_node);
    return ret;
}